

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O1

void __thiscall
TPZTensor<TFad<6,_double>_>::TPZDecomposed::ComputeJ3(TPZDecomposed *this,TFad<6,_double> *J3)

{
  TFad<6,_double> *pTVar1;
  value_type vVar2;
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  long lVar8;
  int i;
  TFad<6,_double> sig3;
  TFad<6,_double> sig2;
  TFad<6,_double> sig1;
  TFad<6,_double> temp;
  TFad<6,_double> s2;
  TFad<6,_double> s1;
  TFad<6,_double> s3;
  double adStack_250 [6];
  undefined **local_220;
  double local_218;
  double adStack_210 [6];
  undefined **local_1e0;
  double local_1d8;
  double adStack_1d0 [6];
  TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>
  local_1a0;
  undefined **local_190;
  undefined8 local_188;
  double adStack_180 [6];
  TFad<6,_double> local_150;
  TFad<6,_double> local_110;
  TFad<6,_double> local_d0;
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> local_90;
  TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>
  local_80;
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> local_70;
  TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>
  local_60;
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> local_50;
  TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>
  local_40;
  TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>
  local_30;
  
  local_1e0 = &PTR__TFad_0185d2b8;
  lVar8 = 0;
  local_220 = &PTR__TFad_0185d2b8;
  local_110.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TFad_0185d2b8;
  local_110.dx_[0] = 0.0;
  local_110.dx_[1] = 0.0;
  local_110.dx_[2] = 0.0;
  local_110.dx_[3] = 0.0;
  local_110.dx_[4] = 0.0;
  local_110.dx_[5] = 0.0;
  local_150.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TFad_0185d2b8;
  local_150.dx_[0] = 0.0;
  local_150.dx_[1] = 0.0;
  local_150.dx_[2] = 0.0;
  local_150.dx_[3] = 0.0;
  local_150.dx_[4] = 0.0;
  local_150.dx_[5] = 0.0;
  local_d0.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TFad_0185d2b8;
  local_d0.dx_[0] = 0.0;
  local_d0.dx_[1] = 0.0;
  local_d0.dx_[2] = 0.0;
  local_d0.dx_[3] = 0.0;
  local_d0.dx_[4] = 0.0;
  local_d0.dx_[5] = 0.0;
  local_190 = &PTR__TFad_0185d2b8;
  local_188 = 0;
  adStack_180[0] = 0.0;
  adStack_180[1] = 0.0;
  adStack_180[2] = 0.0;
  adStack_180[3] = 0.0;
  adStack_180[4] = 0.0;
  adStack_180[5] = 0.0;
  pTVar1 = (this->fEigenvalues).super_TPZVec<TFad<6,_double>_>.fStore;
  adStack_1d0[4] = pTVar1->dx_[4];
  adStack_1d0[5] = pTVar1->dx_[5];
  adStack_1d0[2] = pTVar1->dx_[2];
  adStack_1d0[3] = pTVar1->dx_[3];
  adStack_1d0[0] = pTVar1->dx_[0];
  adStack_1d0[1] = pTVar1->dx_[1];
  local_1d8 = pTVar1->val_;
  adStack_210[4] = pTVar1[1].dx_[4];
  adStack_210[5] = pTVar1[1].dx_[5];
  adStack_210[2] = pTVar1[1].dx_[2];
  adStack_210[3] = pTVar1[1].dx_[3];
  adStack_210[0] = pTVar1[1].dx_[0];
  adStack_210[1] = pTVar1[1].dx_[1];
  local_218 = pTVar1[1].val_;
  adStack_250[4] = pTVar1[2].dx_[4];
  adStack_250[5] = pTVar1[2].dx_[5];
  adStack_250[2] = pTVar1[2].dx_[2];
  adStack_250[3] = pTVar1[2].dx_[3];
  adStack_250[0] = pTVar1[2].dx_[0];
  adStack_250[1] = pTVar1[2].dx_[1];
  local_d0.val_ = pTVar1[2].val_;
  do {
    dVar4 = *(double *)((long)adStack_1d0 + lVar8 + 8);
    dVar4 = (*(double *)((long)adStack_250 + lVar8 + 8) +
            *(double *)((long)adStack_210 + lVar8 + 8) + dVar4) * -0.3333333333333333 + dVar4;
    auVar3._8_4_ = SUB84(dVar4,0);
    auVar3._0_8_ = (*(double *)((long)adStack_250 + lVar8) +
                   *(double *)((long)adStack_210 + lVar8) + *(double *)((long)adStack_1d0 + lVar8))
                   * -0.3333333333333333 + *(double *)((long)adStack_1d0 + lVar8);
    auVar3._12_4_ = (int)((ulong)dVar4 >> 0x20);
    *(undefined1 (*) [16])((long)local_110.dx_ + lVar8) = auVar3;
    lVar8 = lVar8 + 0x10;
  } while (lVar8 != 0x30);
  dVar4 = (local_1d8 + local_218 + local_d0.val_) * 0.3333333333333333;
  local_110.val_ = local_1d8 - dVar4;
  lVar8 = 0;
  do {
    dVar5 = *(double *)((long)adStack_210 + lVar8 + 8);
    dVar6 = *(double *)((long)adStack_1d0 + lVar8 + 8);
    dVar7 = *(double *)((long)adStack_250 + lVar8 + 8);
    *(double *)((long)local_150.dx_ + lVar8) =
         (*(double *)((long)adStack_250 + lVar8) +
         *(double *)((long)adStack_1d0 + lVar8) + *(double *)((long)adStack_210 + lVar8)) *
         -0.3333333333333333 + *(double *)((long)adStack_210 + lVar8);
    *(double *)((long)local_150.dx_ + lVar8 + 8) =
         (dVar7 + dVar6 + dVar5) * -0.3333333333333333 + dVar5;
    lVar8 = lVar8 + 0x10;
  } while (lVar8 != 0x30);
  local_150.val_ = local_218 - dVar4;
  lVar8 = 0;
  do {
    dVar5 = *(double *)((long)adStack_250 + lVar8 + 8);
    dVar6 = *(double *)((long)adStack_1d0 + lVar8 + 8);
    dVar7 = *(double *)((long)adStack_210 + lVar8 + 8);
    *(double *)((long)local_d0.dx_ + lVar8) =
         (*(double *)((long)adStack_210 + lVar8) + *(double *)((long)adStack_1d0 + lVar8) +
         *(double *)((long)adStack_250 + lVar8)) * -0.3333333333333333 +
         *(double *)((long)adStack_250 + lVar8);
    *(double *)((long)local_d0.dx_ + lVar8 + 8) =
         (dVar7 + dVar6 + dVar5) * -0.3333333333333333 + dVar5;
    lVar8 = lVar8 + 0x10;
  } while (lVar8 != 0x30);
  local_d0.val_ = local_d0.val_ - dVar4;
  local_90.fadexpr_.left_ = &local_d0;
  local_50.fadexpr_.left_ = &local_110;
  local_40.fadexpr_.left_ = &local_50;
  local_30.fadexpr_.left_ = &local_40;
  local_70.fadexpr_.left_ = &local_150;
  local_60.fadexpr_.left_ = &local_70;
  local_30.fadexpr_.right_ = &local_60;
  local_1a0.left_ = &local_30;
  local_80.fadexpr_.left_ = &local_90;
  local_1a0.right_ = &local_80;
  lVar8 = 0;
  local_90.fadexpr_.right_ = local_90.fadexpr_.left_;
  local_80.fadexpr_.right_ = local_90.fadexpr_.left_;
  local_70.fadexpr_.right_ = local_70.fadexpr_.left_;
  local_60.fadexpr_.right_ = local_70.fadexpr_.left_;
  local_50.fadexpr_.right_ = local_50.fadexpr_.left_;
  local_40.fadexpr_.right_ = local_50.fadexpr_.left_;
  do {
    vVar2 = TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>
            ::dx(&local_1a0,(int)lVar8);
    adStack_180[lVar8] = vVar2 * 0.3333333333333333;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 6);
  vVar2 = TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>
          ::val(&local_1a0);
  J3->dx_[4] = adStack_180[4];
  J3->dx_[5] = adStack_180[5];
  J3->dx_[2] = adStack_180[2];
  J3->dx_[3] = adStack_180[3];
  J3->dx_[0] = adStack_180[0];
  J3->dx_[1] = adStack_180[1];
  J3->val_ = vVar2 * 0.3333333333333333;
  return;
}

Assistant:

void ComputeJ3(T & J3) {
            T sig1, sig2, sig3, s1, s2, s3, temp;
            sig1 = this->fEigenvalues[0];
            sig2 = this->fEigenvalues[1];
            sig3 = this->fEigenvalues[2];
            s1 = sig1 - (1. / 3.)*(sig1 + sig2 + sig3);
            s2 = sig2 - (1. / 3.)*(sig1 + sig2 + sig3);
            s3 = sig3 - (1. / 3.)*(sig1 + sig2 + sig3);
            temp = (1. / 3.)*(s1 * s1 * s1 + s2 * s2 * s2 + s3 * s3 * s3);
            J3 = temp;
        }